

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O0

void __thiscall
FastPForLib::FastPForImpl<4U,_unsigned_int>::encodeArray
          (FastPForImpl<4U,_unsigned_int> *this,uint *in,size_t length,uint32_t *out,size_t *nvalue)

{
  logic_error *this_00;
  undefined4 *in_RCX;
  long in_RDX;
  ulong in_RSI;
  FastPForImpl<4U,_unsigned_int> *in_RDI;
  ulong *in_R8;
  string msg;
  size_t thisnvalue;
  size_t thissize;
  size_t oldnvalue;
  uint *finalin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  string *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  string *this_02;
  ulong local_148;
  string local_138 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  string local_108 [32];
  string local_e8 [8];
  size_t *in_stack_ffffffffffffff20;
  uint32_t *in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff3c;
  FastPForImpl<4U,_unsigned_int> *in_stack_ffffffffffffff40;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  long local_48;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  ulong *local_28;
  undefined4 *local_20;
  long local_18;
  ulong local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  checkifdivisibleby((size_t)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  local_30 = local_10 + local_18 * 4;
  *local_20 = (int)local_18;
  local_38 = *local_28;
  *local_28 = 1;
  local_20 = local_20 + 1;
  for (; local_10 != local_30; local_10 = local_40 * 4 + local_10) {
    if (local_10 + (ulong)in_RDI->PageSize * 4 < local_30) {
      local_148 = (ulong)in_RDI->PageSize;
    }
    else {
      local_148 = (long)(local_30 - local_10) >> 2;
    }
    local_40 = local_148;
    local_48 = 0;
    __encodeArray(in_stack_ffffffffffffff40,
                  (uint *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                  in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    *local_28 = local_48 + *local_28;
    local_20 = local_20 + local_48;
  }
  if (local_38 < *local_28) {
    std::__cxx11::string::string(local_68);
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffed8);
    std::operator+((char *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    std::operator+(in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0);
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffed8);
    std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    std::operator+(in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0);
    this_02 = local_68;
    this_01 = local_88;
    std::__cxx11::string::operator=(this_02,this_01);
    std::__cxx11::string::~string(this_01);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_108);
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,this_02);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  resetBuffer(in_RDI);
  return;
}

Assistant:

void encodeArray(const IntType *in, const size_t length, uint32_t *out,
                   size_t &nvalue) {
    checkifdivisibleby(length, BlockSize);
    const IntType *const finalin(in + length);

    *out++ = static_cast<uint32_t>(length);
    const size_t oldnvalue = nvalue;
    nvalue = 1;
    while (in != finalin) {
      size_t thissize = static_cast<size_t>(
          finalin > PageSize + in ? PageSize : (finalin - in));
      size_t thisnvalue(0);
      __encodeArray(in, thissize, out, thisnvalue);
      nvalue += thisnvalue;
      out += thisnvalue;
      in += thissize;
    }
    if (oldnvalue < nvalue) {
      std::string msg;
      msg = "It is possible we have a buffer overrun. You reported having "
            "allocated "
          + std::to_string(oldnvalue * sizeof(uint32_t))
          + " bytes for the compressed data but we needed "
          + std::to_string(nvalue * sizeof(uint32_t))
          + " bytes. Please increase the available memory"
            " for compressed data or check the value of the last parameter "
            "provided "
            " to the encodeArray method.";
      throw std::logic_error(msg);
    }
    resetBuffer();  // if you don't do this, the buffer has a memory
  }